

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O2

void __thiscall Assimp::D3MF::XmlSerializer::ImportVertices(XmlSerializer *this,aiMesh *mesh)

{
  pointer __src;
  pointer paVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  aiVector3D *__s;
  ulong uVar5;
  size_t __n;
  aiVector3D aVar6;
  aiVector3t<float> local_58;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> vertices;
  
  vertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  while( true ) {
    bVar2 = ReadToEndElement(this,(string *)XmlTag::vertices_abi_cxx11_);
    paVar1 = vertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    __src = vertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
    if (!bVar2) break;
    iVar3 = (*this->xmlReader->_vptr_IIrrXMLReader[0xd])();
    bVar2 = std::operator==((char *)CONCAT44(extraout_var,iVar3),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            XmlTag::vertex_abi_cxx11_);
    if (bVar2) {
      aVar6 = ReadVertex(this);
      local_58.z = aVar6.z;
      local_58._0_8_ = aVar6._0_8_;
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      emplace_back<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&vertices,&local_58)
      ;
    }
  }
  __n = (long)vertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)vertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)__n / 0xc;
  mesh->mNumVertices = (uint)uVar4;
  uVar4 = uVar4 & 0xffffffff;
  uVar5 = uVar4 * 0xc;
  __s = (aiVector3D *)operator_new__(uVar5);
  if (uVar4 != 0) {
    uVar5 = uVar5 - 0xc;
    memset(__s,0,(uVar5 - uVar5 % 0xc) + 0xc);
  }
  mesh->mVertices = __s;
  if (paVar1 != __src) {
    memmove(__s,__src,__n);
  }
  std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
            (&vertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>);
  return;
}

Assistant:

void ImportVertices(aiMesh* mesh) {
        std::vector<aiVector3D> vertices;
        while(ReadToEndElement(D3MF::XmlTag::vertices)) {
            if(xmlReader->getNodeName() == D3MF::XmlTag::vertex) {
                vertices.push_back(ReadVertex());
            }
        }
        mesh->mNumVertices = static_cast<unsigned int>(vertices.size());
        mesh->mVertices = new aiVector3D[mesh->mNumVertices];

        std::copy(vertices.begin(), vertices.end(), mesh->mVertices);
    }